

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddmc.c
# Opt level: O0

void set_save(FILE *f,set_t set)

{
  size_t local_28;
  size_t dd;
  set_t psStack_18;
  int k;
  set_t set_local;
  FILE *f_local;
  
  dd._4_4_ = 0xffffffff;
  psStack_18 = set;
  set_local = (set_t)f;
  fwrite((void *)((long)&dd + 4),4,1,(FILE *)f);
  local_28 = lddmc_serialize_add(psStack_18->dd);
  lddmc_serialize_tofile((FILE *)set_local);
  fwrite(&local_28,8,1,(FILE *)set_local);
  return;
}

Assistant:

static void
set_save(FILE* f, set_t set)
{
    int k = -1;
    fwrite(&k, sizeof(int), 1, f);
    size_t dd = lddmc_serialize_add(set->dd);
    lddmc_serialize_tofile(f);
    fwrite(&dd, sizeof(size_t), 1, f);
}